

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::preceding
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int32_t *piVar5;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  
  if ((fromPos <= this->fStart) || (this->fLimit < fromPos)) {
    this->fPositionInCache = -1;
    return '\0';
  }
  if (this->fLimit == fromPos) {
    this->fPositionInCache = (this->fBreaks).count + -1;
  }
  iVar2 = this->fPositionInCache;
  if ((0 < (long)iVar2) && (iVar3 = (this->fBreaks).count, iVar2 < iVar3)) {
    if (iVar3 < 1) {
      iVar7 = 0;
    }
    else {
      iVar7 = (this->fBreaks).elements[iVar2];
    }
    if (iVar7 == fromPos) {
      this->fPositionInCache = iVar2 - 1U;
      iVar6 = 0;
      if (iVar2 <= iVar3 && 0 < iVar3) {
        iVar6 = (this->fBreaks).elements[iVar2 - 1U];
      }
      *result = iVar6;
      iVar7 = (&this->fFirstRuleStatusIndex)[iVar6 != this->fStart];
      goto LAB_0029f3a8;
    }
  }
  if (iVar2 == 0) {
LAB_0029f3ae:
    this->fPositionInCache = -1;
    return '\0';
  }
  uVar4 = (this->fBreaks).count;
  piVar5 = (this->fBreaks).elements;
  uVar8 = uVar4;
  do {
    uVar1 = uVar8 - 1;
    this->fPositionInCache = uVar1;
    if ((int)uVar8 < 1) goto LAB_0029f3ae;
    iVar7 = 0;
    if ((int)uVar8 <= (int)uVar4 && 0 < (int)uVar4) {
      iVar7 = piVar5[uVar1];
    }
    uVar8 = uVar1;
  } while (fromPos <= iVar7);
  *result = iVar7;
  iVar7 = (&this->fFirstRuleStatusIndex)[iVar7 != this->fStart];
LAB_0029f3a8:
  *statusIndex = iVar7;
  return '\x01';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::preceding(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos <= fStart || fromPos > fLimit) {
        fPositionInCache = -1;
        return FALSE;
    }

    if (fromPos == fLimit) {
        fPositionInCache = fBreaks.size() - 1;
        if (fPositionInCache >= 0) {
            U_ASSERT(fBreaks.elementAti(fPositionInCache) == fromPos);
        }
    }

    int32_t r;
    if (fPositionInCache > 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        --fPositionInCache;
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r < fromPos);
        *result = r;
        *statusIndex = ( r== fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
        return TRUE;
    }

    if (fPositionInCache == 0) {
        fPositionInCache = -1;
        return FALSE;
    }

    for (fPositionInCache = fBreaks.size()-1; fPositionInCache >= 0; --fPositionInCache) {
        r = fBreaks.elementAti(fPositionInCache);
        if (r < fromPos) {
            *result = r;
            *statusIndex = ( r == fStart) ? fFirstRuleStatusIndex : fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}